

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O2

int Eigen::internal::coletree<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<int,_1,1,0,_1,1>>
              (SparseMatrix<double,_0,_int> *mat,Matrix<int,__1,_1,_0,__1,_1> *parent,
              Matrix<int,__1,_1,_0,__1,_1> *firstRowElt,Index *perm)

{
  bool bVar1;
  uint uVar2;
  DenseIndex DVar3;
  uint uVar4;
  ulong uVar5;
  Scalar *pSVar6;
  uint *puVar7;
  ulong uVar8;
  Index IVar9;
  long lVar10;
  int iVar11;
  Scalar SVar12;
  ulong index;
  int iVar13;
  long index_00;
  Scalar local_b0;
  int local_ac;
  Index *local_a8;
  undefined1 local_a0 [8];
  InnerIterator it;
  void *local_78;
  Matrix<int,__1,_1,_0,__1,_1> root;
  undefined1 local_60 [8];
  Matrix<int,__1,_1,_0,__1,_1> pp;
  uint local_34 [2];
  Index nc;
  
  local_34[0] = mat->m_outerSize;
  lVar10 = (long)(int)local_34[0];
  uVar4 = mat->m_innerSize;
  root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (DenseIndex)(int)uVar4;
  uVar2 = local_34[0];
  if ((int)uVar4 < (int)local_34[0]) {
    uVar2 = uVar4;
  }
  pp.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (DenseIndex)firstRowElt;
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&local_78,lVar10);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_78);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_60,lVar10);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_60);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
             (long)mat->m_outerSize);
  DVar3 = pp.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
             pp.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)DVar3,(Scalar *)local_34);
  VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_a0,
             (Matrix<int,__1,_1,_0,__1,_1> *)DVar3,0,(long)(int)uVar2);
  local_b0 = 0;
  local_ac = uVar2 - 1;
  DenseBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setLinSpaced
            ((DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)local_a0
             ,(long)(int)uVar2,&local_b0,&local_ac);
  DVar3 = pp.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  for (lVar10 = 0; uVar5 = (ulong)(int)local_34[0], lVar10 < (long)uVar5; lVar10 = lVar10 + 1) {
    iVar13 = (int)lVar10;
    IVar9 = iVar13;
    if (perm != (Index *)0x0) {
      IVar9 = perm[lVar10];
    }
    SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator((InnerIterator *)local_a0,mat,IVar9);
    for (; it.m_indices._4_4_ < it.m_outer; it.m_indices._4_4_ = it.m_indices._4_4_ + 1) {
      index_00 = (long)*(int *)((long)it.m_values + (long)it.m_indices._4_4_ * 4);
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)DVar3,index_00)
      ;
      iVar11 = *pSVar6;
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)DVar3,index_00)
      ;
      if (iVar13 < iVar11) {
        iVar11 = iVar13;
      }
      *pSVar6 = iVar11;
    }
  }
  local_a8 = perm;
  for (index = 0; (long)index < (long)(int)uVar5; index = index + 1) {
    bVar1 = root.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)index;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_60,index);
    SVar12 = (Scalar)index;
    *pSVar6 = SVar12;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_78,index);
    uVar4 = local_34[0];
    *pSVar6 = SVar12;
    puVar7 = (uint *)DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent,
                                index);
    *puVar7 = uVar4;
    IVar9 = SVar12;
    if (local_a8 != (Index *)0x0) {
      IVar9 = local_a8[index];
    }
    SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator((InnerIterator *)local_a0,mat,IVar9);
    uVar5 = index & 0xffffffff;
    for (; (it.m_indices._4_4_ < it.m_outer || (!bVar1)); bVar1 = (bool)(bVar1 | index == uVar8)) {
      uVar8 = index & 0xffffffff;
      if (it.m_indices._4_4_ < it.m_outer) {
        uVar8 = (ulong)*(uint *)((long)it.m_values + (long)it.m_indices._4_4_ * 4);
      }
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                          pp.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows,(long)(int)uVar8);
      if ((long)*pSVar6 < (long)index) {
        uVar4 = etree_find<int,Eigen::Matrix<int,_1,1,0,_1,1>>
                          (*pSVar6,(Matrix<int,__1,_1,_0,__1,_1> *)local_60);
        puVar7 = (uint *)DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    &local_78,(long)(int)uVar4);
        if (index != *puVar7) {
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent,
                              (long)(int)*puVar7);
          *pSVar6 = SVar12;
          puVar7 = (uint *)DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                      local_60,(long)(int)uVar5);
          uVar5 = (ulong)uVar4;
          *puVar7 = uVar4;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_78,
                              (long)(int)uVar4);
          *pSVar6 = SVar12;
        }
      }
      it.m_indices._4_4_ = it.m_indices._4_4_ + 1;
    }
    uVar5 = (ulong)local_34[0];
  }
  free((void *)local_60);
  free(local_78);
  return 0;
}

Assistant:

int coletree(const MatrixType& mat, IndexVector& parent, IndexVector& firstRowElt, typename MatrixType::Index *perm=0)
{
  typedef typename MatrixType::Index Index;
  Index nc = mat.cols(); // Number of columns 
  Index m = mat.rows();
  Index diagSize = (std::min)(nc,m);
  IndexVector root(nc); // root of subtree of etree 
  root.setZero();
  IndexVector pp(nc); // disjoint sets 
  pp.setZero(); // Initialize disjoint sets 
  parent.resize(mat.cols());
  //Compute first nonzero column in each row 
  Index row,col; 
  firstRowElt.resize(m);
  firstRowElt.setConstant(nc);
  firstRowElt.segment(0, diagSize).setLinSpaced(diagSize, 0, diagSize-1);
  bool found_diag;
  for (col = 0; col < nc; col++)
  {
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it; ++it)
    { 
      row = it.row();
      firstRowElt(row) = (std::min)(firstRowElt(row), col);
    }
  }
  /* Compute etree by Liu's algorithm for symmetric matrices,
          except use (firstRowElt[r],c) in place of an edge (r,c) of A.
    Thus each row clique in A'*A is replaced by a star
    centered at its first vertex, which has the same fill. */
  Index rset, cset, rroot; 
  for (col = 0; col < nc; col++) 
  {
    found_diag = col>=m;
    pp(col) = col; 
    cset = col; 
    root(cset) = col; 
    parent(col) = nc; 
    /* The diagonal element is treated here even if it does not exist in the matrix
     * hence the loop is executed once more */ 
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it||!found_diag; ++it)
    { //  A sequence of interleaved find and union is performed 
      Index i = col;
      if(it) i = it.index();
      if (i == col) found_diag = true;
      
      row = firstRowElt(i);
      if (row >= col) continue; 
      rset = internal::etree_find(row, pp); // Find the name of the set containing row
      rroot = root(rset);
      if (rroot != col) 
      {
        parent(rroot) = col; 
        pp(cset) = rset; 
        cset = rset; 
        root(cset) = col; 
      }
    }
  }
  return 0;  
}